

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RVOSimulator.cpp
# Opt level: O1

size_t __thiscall
RVO::RVOSimulator::addAgent
          (RVOSimulator *this,Vector2 *position,float neighborDist,size_t maxNeighbors,
          float timeHorizon,float timeHorizonObst,float radius,float maxSpeed,Vector2 *velocity)

{
  pointer *pppAVar1;
  iterator __position;
  Agent *this_00;
  Agent *agent;
  Agent *local_30;
  
  this_00 = (Agent *)operator_new(0x98);
  Agent::Agent(this_00,this);
  this_00->position_ = *position;
  this_00->maxNeighbors_ = maxNeighbors;
  this_00->maxSpeed_ = maxSpeed;
  this_00->neighborDist_ = neighborDist;
  this_00->radius_ = radius;
  this_00->timeHorizon_ = timeHorizon;
  this_00->timeHorizonObst_ = timeHorizonObst;
  this_00->velocity_ = *velocity;
  __position._M_current =
       (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  this_00->id_ = (long)__position._M_current -
                 (long)(this->agents_).
                       super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3;
  if (__position._M_current ==
      (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_30 = this_00;
    std::vector<RVO::Agent*,std::allocator<RVO::Agent*>>::_M_realloc_insert<RVO::Agent*const&>
              ((vector<RVO::Agent*,std::allocator<RVO::Agent*>> *)this,__position,&local_30);
  }
  else {
    *__position._M_current = this_00;
    pppAVar1 = &(this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppAVar1 = *pppAVar1 + 1;
  }
  return ((long)(this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3) - 1;
}

Assistant:

size_t RVOSimulator::addAgent(const Vector2 &position, float neighborDist, size_t maxNeighbors, float timeHorizon, float timeHorizonObst, float radius, float maxSpeed, const Vector2 &velocity)
	{
		Agent *agent = new Agent(this);

		agent->position_ = position;
		agent->maxNeighbors_ = maxNeighbors;
		agent->maxSpeed_ = maxSpeed;
		agent->neighborDist_ = neighborDist;
		agent->radius_ = radius;
		agent->timeHorizon_ = timeHorizon;
		agent->timeHorizonObst_ = timeHorizonObst;
		agent->velocity_ = velocity;

		agent->id_ = agents_.size();

		agents_.push_back(agent);

		return agents_.size() - 1;
	}